

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datset.cpp
# Opt level: O3

list<cv::Mat,_std::allocator<cv::Mat>_> *
randomWarps_abi_cxx11_
          (list<cv::Mat,_std::allocator<cv::Mat>_> *__return_storage_ptr__,Mat *plate,int n)

{
  size_t *psVar1;
  Mat *this;
  uint uVar2;
  ulong uVar3;
  _Node *p_Var4;
  size_t __i;
  long lVar5;
  int in_R8D;
  int iVar6;
  double dVar7;
  double dVar8;
  Mat platew;
  Mat respl;
  Mat res;
  Mat grey;
  mt19937 gen;
  random_device rd;
  _InputArray local_29c0;
  Mat *local_29a8;
  double local_29a0;
  double local_2998;
  undefined4 local_2990 [2];
  Mat *local_2988;
  undefined8 local_2980;
  undefined1 local_2930 [112];
  Mat local_28c0 [96];
  Mat local_2860 [96];
  Mat local_2800 [96];
  Mat local_27a0 [96];
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2740;
  random_device local_13b8;
  
  (__return_storage_ptr__->super__List_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl._M_node.
  _M_size = 0;
  local_29a8 = plate;
  std::random_device::random_device(&local_13b8);
  uVar2 = std::random_device::_M_getval();
  local_2740._M_x[0] = (unsigned_long)uVar2;
  lVar5 = 1;
  uVar3 = local_2740._M_x[0];
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar5);
    local_2740._M_x[lVar5] = uVar3;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x270);
  local_2740._M_p = 0x270;
  if (0 < n) {
    iVar6 = 0;
    do {
      uVar2 = std::random_device::_M_getval();
      local_2740._M_x[0] = (unsigned_long)uVar2;
      lVar5 = 1;
      uVar3 = local_2740._M_x[0];
      do {
        uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar5);
        local_2740._M_x[lVar5] = uVar3;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x270);
      local_2740._M_p = 0x270;
      dVar7 = std::
              generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (&local_2740);
      local_2998 = (dVar7 + dVar7 + -1.0) * 25.0;
      dVar7 = std::
              generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (&local_2740);
      dVar8 = std::
              generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (&local_2740);
      local_29a0 = (dVar8 + dVar8 + -1.0) * 10.0;
      this = (Mat *)(local_2930 + 0x10);
      cv::Mat::Mat(this);
      cv::Mat::Mat(local_2860);
      cv::Mat::Mat(local_27a0);
      cv::Mat::Mat(local_2800);
      rotateImage(local_29a8,this,local_2998,(dVar7 + dVar7 + -1.0) * 25.0,local_29a0,0.0,0.0,300.0,
                  200.0);
      local_2980 = 0;
      local_2990[0] = 0x1010000;
      local_29c0.sz.width = 0;
      local_29c0.sz.height = 0;
      local_29c0.flags = 0x2010000;
      local_29c0.obj = local_27a0;
      local_2988 = this;
      cv::cvtColor((cv *)local_2990,&local_29c0,(_OutputArray *)0x6,0,in_R8D);
      local_29c0.sz.width = 0;
      local_29c0.sz.height = 0;
      local_29c0.flags = 0x1010000;
      local_29c0.obj = local_27a0;
      cv::boundingRect((_InputArray *)local_2930);
      cv::Mat::Mat((Mat *)local_2990,(Mat *)(local_2930 + 0x10),(Rect_ *)local_2930);
      cv::Mat::operator=(local_2800,(Mat *)local_2990);
      cv::Mat::~Mat((Mat *)local_2990);
      cv::Mat::Mat(local_28c0,local_2800);
      clearBg((Mat *)local_2990);
      p_Var4 = std::__cxx11::list<cv::Mat,_std::allocator<cv::Mat>_>::_M_create_node<cv::Mat>
                         (__return_storage_ptr__,(Mat *)local_2990);
      std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
      psVar1 = &(__return_storage_ptr__->super__List_base<cv::Mat,_std::allocator<cv::Mat>_>).
                _M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      cv::Mat::~Mat((Mat *)local_2990);
      cv::Mat::~Mat(local_28c0);
      cv::Mat::~Mat(local_2800);
      cv::Mat::~Mat(local_27a0);
      cv::Mat::~Mat(local_2860);
      cv::Mat::~Mat((Mat *)(local_2930 + 0x10));
      iVar6 = iVar6 + 1;
    } while (iVar6 != n);
  }
  std::random_device::_M_fini();
  return __return_storage_ptr__;
}

Assistant:

list<cv::Mat> randomWarps(cv::Mat plate, int n) {
    list<cv::Mat> warps;

    random_device rd;  //Will be used to obtain a seed for the random number engine
    mt19937 gen(rd());
    uniform_real_distribution<> realgen(-1.f, 1.f);

    for (int i =0; i<n; i++) {
        gen.seed(rd());
        auto xangl = realgen(gen)*25.;
        auto yangl = realgen(gen)*25.;
        auto zangl = realgen(gen)*10.;
        cv::Mat platew, respl, grey, res;
        rotateImage(plate, platew, xangl, yangl,zangl, 0,0,300, 200);
        cv::cvtColor(platew, grey, cv::COLOR_BGR2GRAY);
        res = platew(cv::boundingRect(grey));
        warps.push_back(clearBg(res));
    }
    return warps; 
}